

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O0

void __thiscall
duel::playCard(duel *this,hand *hand__,hand *enemyHand,field *field__,field *enemyField,
              uint position)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  reference pvVar4;
  uint *puVar5;
  ostream *poVar6;
  bool local_142;
  bool local_e1;
  undefined1 local_e0 [32];
  undefined1 local_c0 [44];
  uint enemyPosition;
  undefined1 local_88 [40];
  card temp;
  uint position_local;
  field *enemyField_local;
  field *field___local;
  hand *enemyHand_local;
  hand *hand___local;
  duel *this_local;
  
  temp._44_4_ = position;
  pvVar4 = std::vector<card,_std::allocator<card>_>::at(&hand__->hand_,(ulong)position);
  card::card((card *)(local_88 + 0x20),pvVar4);
  uVar2 = card::getValue((card *)(local_88 + 0x20));
  local_c0[0x2b] = 0;
  local_e1 = true;
  if (uVar2 < 3) {
    card::getName_abi_cxx11_((card *)local_88);
    local_c0[0x2b] = 1;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,"1");
    if (bVar1) {
      bVar1 = isBolted(field__);
      local_e1 = true;
      if (!bVar1) goto LAB_00104c4e;
    }
    local_e1 = isForce((card *)(local_88 + 0x20));
  }
LAB_00104c4e:
  if ((local_c0[0x2b] & 1) != 0) {
    std::__cxx11::string::~string((string *)local_88);
  }
  if (local_e1 != false) {
    std::vector<card,std::allocator<card>>::emplace_back<card&>
              ((vector<card,std::allocator<card>> *)&field__->field_,(card *)(local_88 + 0x20));
  }
  uVar2 = card::getCardType((card *)(local_88 + 0x20));
  switch(uVar2) {
  case 1:
    pvVar4 = std::vector<card,_std::allocator<card>_>::back(&enemyField->field_);
    card::setBolted(pvVar4,true);
    pvVar4 = std::vector<card,_std::allocator<card>_>::back(&enemyField->field_);
    bVar1 = isForce(pvVar4);
    if (bVar1) {
      puVar5 = field::getPile(enemyField);
      field::setPile(enemyField,*puVar5 >> 1);
    }
    else {
      puVar5 = field::getPile(enemyField);
      uVar2 = *puVar5;
      pvVar4 = std::vector<card,_std::allocator<card>_>::back(&enemyField->field_);
      uVar3 = card::getValue(pvVar4);
      field::setPile(enemyField,uVar2 - uVar3);
    }
    break;
  case 2:
    std::swap<field>(field__,enemyField);
    break;
  case 3:
    hand::shuffleHand(enemyHand);
    local_c0._36_4_ = pickCard(this,enemyHand,true);
    poVar6 = std::operator<<((ostream *)&std::cout,"Card discarded was ");
    std::vector<card,_std::allocator<card>_>::at(&enemyHand->hand_,(ulong)(uint)local_c0._36_4_);
    card::getName_abi_cxx11_((card *)local_c0);
    poVar6 = std::operator<<(poVar6,(string *)local_c0);
    poVar6 = std::operator<<(poVar6,".");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_c0);
    discardCard(this,local_c0._36_4_,enemyHand);
    hand::sortHand(enemyHand);
    break;
  case 4:
    puVar5 = field::getPile(field__);
    field::setPile(field__,*puVar5 << 1);
    break;
  default:
    card::getName_abi_cxx11_((card *)local_e0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_e0,"1");
    local_142 = false;
    if (bVar1) {
      local_142 = isBolted(field__);
    }
    std::__cxx11::string::~string((string *)local_e0);
    if (local_142 == false) {
      puVar5 = field::getPile(field__);
      uVar2 = *puVar5;
      uVar3 = card::getValue((card *)(local_88 + 0x20));
      field::setPile(field__,uVar2 + uVar3);
    }
    else {
      pvVar4 = std::vector<card,_std::allocator<card>_>::back(&field__->field_);
      card::setBolted(pvVar4,false);
      pvVar4 = std::vector<card,_std::allocator<card>_>::back(&field__->field_);
      bVar1 = isForce(pvVar4);
      if (bVar1) {
        puVar5 = field::getPile(field__);
        field::setPile(field__,*puVar5 << 1);
      }
      else {
        puVar5 = field::getPile(field__);
        uVar2 = *puVar5;
        pvVar4 = std::vector<card,_std::allocator<card>_>::back(&field__->field_);
        uVar3 = card::getValue(pvVar4);
        field::setPile(field__,uVar2 + uVar3);
      }
    }
  }
  uVar2 = card::getCardType((card *)(local_88 + 0x20));
  if (uVar2 == 3) {
    discardCard(this,temp._44_4_,hand__);
    poVar6 = std::operator<<((ostream *)&std::cout,"Now play another card.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    printField(this);
    uVar2 = pickCard(this,hand__,false);
    playCard(this,hand__,enemyHand,field__,enemyField,uVar2);
  }
  else {
    discardCard(this,temp._44_4_,hand__);
  }
  card::~card((card *)(local_88 + 0x20));
  return;
}

Assistant:

void duel::playCard(hand &hand__, hand &enemyHand, field &field__, field &enemyField, unsigned int position) {
    // create pointer to card that is played
    /*unique_ptr<card> temp(&hand__.hand_.at(position));*/
	card temp = hand__.hand_.at(position);
    // put the card on the field if it has a value > 2 or if it is a '1' card and pile isn't bolted is or if it is force
    if( (temp.getValue() > 2 || (temp.getName()=="1" && !isBolted(field__)))
    || (isForce(temp))) field__.field_.emplace_back(temp);
    switch (temp.getCardType()) {
        // bolt, nullify a cards value/effect
        case 1:
            enemyField.field_.back().setBolted(true);
            // if enemy used force, revert it; else subtract the enemy's top card value
            if (isForce(enemyField.field_.back())) enemyField.setPile(enemyField.getPile() / 2);
            else enemyField.setPile(enemyField.getPile() - enemyField.field_.back().getValue());
            break;
        //mirror, swaps the fields
        case 2:
            swap(field__, enemyField);
            break;
        // blast, shuffles enemy hand and lets you choose which card from that hand to discard
        case 3:
            unsigned int enemyPosition;
            enemyHand.shuffleHand();
            // discard a card from the enemy's Hand
            enemyPosition = pickCard(enemyHand,true);
            cout << "Card discarded was " << enemyHand.hand_.at(enemyPosition).getName() << "." << endl;
            discardCard(enemyPosition, enemyHand);
            // sort it back
            enemyHand.sortHand();
            break;
        // force, doubles pile
        case 4:
            field__.setPile(field__.getPile() * 2);
            break;
        // regular card
        default:
            // if card played is '1' and top card on field is bolted, unbolt it
            if(temp.getName()=="1" && isBolted(field__)) {
                field__.field_.back().setBolted(false);
                // if bolted card was force, double pile; else add the bolted card's value back to pile
                if(isForce(field__.field_.back())) field__.setPile(field__.getPile() * 2);
                else field__.setPile(field__.getPile() + field__.field_.back().getValue());
            }
            // add value to pile when above condition is false
            else field__.setPile(field__.getPile() + temp.getValue());
            break;
    }
    // if blast was played, discard blast and play another card
    if(temp.getCardType() == 3) {
        discardCard(position,hand__);
        cout << "Now play another card." << endl;
        printField();
        playCard(hand__,enemyHand,field__,enemyField,pickCard(hand__,false));
    }
    // else discard card used from hand
    else discardCard(position,hand__);
}